

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

int main(int argc,char **argv)

{
  FILE *pFVar1;
  int iVar2;
  int *piVar3;
  char *pcVar4;
  FILE *local_88;
  FILE *local_78;
  int local_4c;
  FILE *pFStack_48;
  int ret;
  FILE *output;
  FILE *input;
  char *ptr;
  char *search_dir;
  char *out_file;
  char *in_file;
  char **argv_local;
  int argc_local;
  
  out_file = (char *)0x0;
  search_dir = (char *)0x0;
  ptr = ".";
  output = (FILE *)0x0;
  pFStack_48 = (FILE *)0x0;
  local_4c = 1;
  if (argc != 1) {
    if (argc == 2) {
      iVar2 = strcmp(argv[1],"-h");
      if ((iVar2 == 0) || (iVar2 = strcmp(argv[1],"--help"), iVar2 == 0)) {
        fprintf(_stdout,"Usage:\n\t%s [input-file] [output-file]\n",*argv);
        return 0;
      }
      out_file = argv[1];
    }
    else {
      if (argc != 3) {
        fprintf(_stderr,"Invalid arguments.\n");
        return 1;
      }
      out_file = argv[1];
      search_dir = argv[2];
    }
  }
  if (out_file != (char *)0x0) {
    output = (FILE *)fopen(out_file,"r");
    pFVar1 = _stderr;
    if ((FILE *)output == (FILE *)0x0) {
      piVar3 = __errno_location();
      pcVar4 = strerror(*piVar3);
      fprintf(pFVar1,"Failed to open \"%s\" for reading (%s).\n",out_file,pcVar4);
      goto LAB_00101537;
    }
    pcVar4 = strrchr(out_file,0x2f);
    if (pcVar4 != (char *)0x0) {
      *pcVar4 = '\0';
      ptr = out_file;
    }
  }
  if ((search_dir == (char *)0x0) ||
     (pFStack_48 = fopen(search_dir,"w"), pFVar1 = _stderr, output != (FILE *)0x0)) {
    if (pFStack_48 == (FILE *)0x0) {
      local_78 = _stdout;
    }
    else {
      local_78 = pFStack_48;
    }
    if (output == (FILE *)0x0) {
      local_88 = _stdin;
    }
    else {
      local_88 = output;
    }
    local_4c = convert_yang2yin((FILE *)local_78,local_88,ptr);
  }
  else {
    piVar3 = __errno_location();
    pcVar4 = strerror(*piVar3);
    fprintf(pFVar1,"Failed to open \"%s\" for writing (%s).\n",search_dir,pcVar4);
  }
LAB_00101537:
  if (output != (FILE *)0x0) {
    fclose((FILE *)output);
  }
  if (pFStack_48 != (FILE *)0x0) {
    fclose(pFStack_48);
  }
  return local_4c;
}

Assistant:

int
main(int argc, char **argv)
{
    const char *in_file = NULL, *out_file = NULL, *search_dir = ".";
    char *ptr;
    FILE *input = NULL, *output = NULL;
    int ret = 1;

    switch (argc) {
    case 1:
        break;
    case 2:
        if (!strcmp(argv[1], "-h") || !strcmp(argv[1], "--help")) {
            fprintf(stdout, "Usage:\n\t%s [input-file] [output-file]\n", argv[0]);
            return 0;
        }
        in_file = argv[1];
        break;
    case 3:
        in_file = argv[1];
        out_file = argv[2];
        break;
    default:
        fprintf(stderr, "Invalid arguments.\n");
        return 1;
    }

    if (in_file) {
        input = fopen(in_file, "r");
        if (!input) {
            fprintf(stderr, "Failed to open \"%s\" for reading (%s).\n", in_file, strerror(errno));
            goto cleanup;
        }

        if ((ptr = strrchr(in_file, '/'))) {
            *ptr = '\0';
            search_dir = in_file;
        }
    }
    if (out_file) {
        output = fopen(out_file, "w");
        if (!input) {
            fprintf(stderr, "Failed to open \"%s\" for writing (%s).\n", out_file, strerror(errno));
            goto cleanup;
        }
    }

    ret = convert_yang2yin(output ? output : stdout, input ? input : stdin, search_dir);

cleanup:
    if (input) {
        fclose(input);
    }
    if (output) {
        fclose(output);
    }
    return ret;
}